

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

void __thiscall mcts::MCTSNode::~MCTSNode(MCTSNode *this)

{
  bool bVar1;
  MCTSNode *this_00;
  reference ppVar2;
  long in_RDI;
  pair<const_long,_mcts::MCTSNode_*> it;
  iterator __end2;
  iterator __begin2;
  unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
  *__range2;
  unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
  *in_stack_ffffffffffffffb8;
  MCTSNode *this_01;
  _Node_iterator_base<std::pair<const_long,_mcts::MCTSNode_*>,_false> local_20;
  _Node_iterator_base<std::pair<const_long,_mcts::MCTSNode_*>,_false> local_18;
  
  this_00 = (MCTSNode *)(in_RDI + 0x18);
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false>::
             operator*((_Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false> *)
                       0x206d59);
    this_01 = ppVar2->second;
    if (this_01 != (MCTSNode *)0x0) {
      ~MCTSNode(this_00);
      operator_delete(this_01);
    }
    std::__detail::_Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_long,_mcts::MCTSNode_*>,_false,_false> *)this_01);
  }
  std::
  unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
  ::~unordered_map((unordered_map<long,_mcts::MCTSNode_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_mcts::MCTSNode_*>_>_>
                    *)0x206daa);
  return;
}

Assistant:

~MCTSNode()
    {
        for (auto it : children)
            delete it.second;
    }